

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_symbols.h
# Opt level: O3

void __thiscall icu_63::numparse::impl::PermilleMatcher::~PermilleMatcher(PermilleMatcher *this)

{
  void *in_RSI;
  
  (this->super_SymbolMatcher).super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_0047b610;
  icu_63::UnicodeString::~UnicodeString(&(this->super_SymbolMatcher).fString);
  NumberParseMatcher::~NumberParseMatcher((NumberParseMatcher *)this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

class U_I18N_API PermilleMatcher : public SymbolMatcher {
  public:
    PermilleMatcher() = default;  // WARNING: Leaves the object in an unusable state

    PermilleMatcher(const DecimalFormatSymbols& dfs);

  protected:
    bool isDisabled(const ParsedNumber& result) const override;

    void accept(StringSegment& segment, ParsedNumber& result) const override;
}